

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O1

int uv_tcp_open(uv_tcp_t *handle,uv_os_sock_t sock)

{
  int iVar1;
  int iVar2;
  
  iVar1 = uv__fd_exists(handle->loop,sock);
  iVar2 = -0x11;
  if (iVar1 == 0) {
    iVar2 = uv__nonblock_ioctl(sock,1);
    if (iVar2 == 0) {
      iVar1 = uv__stream_open((uv_stream_t *)handle,sock,0xc000);
      return iVar1;
    }
  }
  return iVar2;
}

Assistant:

int uv_tcp_open(uv_tcp_t* handle, uv_os_sock_t sock) {
  int err;

  if (uv__fd_exists(handle->loop, sock))
    return UV_EEXIST;

  err = uv__nonblock(sock, 1);
  if (err)
    return err;

  return uv__stream_open((uv_stream_t*)handle,
                         sock,
                         UV_HANDLE_READABLE | UV_HANDLE_WRITABLE);
}